

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O0

void __thiscall pstack::Dwarf::Unit::Unit(Unit *this,Info *di,DWARFReader *r)

{
  DWARFReader *this_00;
  byte bVar1;
  uint16_t uVar2;
  Off OVar3;
  uintmax_t uVar4;
  reference to;
  Exception *this_01;
  Exception *pEVar5;
  size_t local_2b8;
  Exception local_1f0;
  tuple<unsigned_int&,unsigned_long&> local_50 [16];
  pair<unsigned_long,_unsigned_long> local_40 [2];
  DWARFReader *local_20;
  DWARFReader *r_local;
  Info *di_local;
  Unit *this_local;
  
  local_20 = r;
  r_local = (DWARFReader *)di;
  di_local = (Info *)this;
  std::enable_shared_from_this<pstack::Dwarf::Unit>::enable_shared_from_this
            (&this->super_enable_shared_from_this<pstack::Dwarf::Unit>);
  std::
  unordered_map<unsigned_long,_pstack::Dwarf::Abbreviation,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Dwarf::Abbreviation>_>_>
  ::unordered_map(&this->abbreviations);
  std::
  map<unsigned_long,_std::shared_ptr<pstack::Dwarf::DIE::Raw>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<pstack::Dwarf::DIE::Raw>_>_>_>
  ::map(&this->allEntries);
  this->abbrevOffset = 0;
  std::unique_ptr<pstack::Dwarf::LineInfo,std::default_delete<pstack::Dwarf::LineInfo>>::
  unique_ptr<std::default_delete<pstack::Dwarf::LineInfo>,void>
            ((unique_ptr<pstack::Dwarf::LineInfo,std::default_delete<pstack::Dwarf::LineInfo>> *)
             &this->lines);
  std::unique_ptr<pstack::Dwarf::Macros,std::default_delete<pstack::Dwarf::Macros>>::
  unique_ptr<std::default_delete<pstack::Dwarf::Macros>,void>
            ((unique_ptr<pstack::Dwarf::Macros,std::default_delete<pstack::Dwarf::Macros>> *)
             &this->macros);
  std::
  map<unsigned_long,_std::unique_ptr<pstack::Dwarf::Ranges,_std::default_delete<pstack::Dwarf::Ranges>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<pstack::Dwarf::Ranges,_std::default_delete<pstack::Dwarf::Ranges>_>_>_>_>
  ::map(&this->rangesForOffset);
  this->dwarf = (Info *)r_local;
  this->unitType = DW_UT_compile;
  *(undefined8 *)(this->id)._M_elems = 0;
  OVar3 = DWARFReader::getOffset(local_20);
  this->offset = OVar3;
  local_40[0] = DWARFReader::getlength(local_20);
  std::tie<unsigned_int,unsigned_long>((uint *)local_50,(unsigned_long *)&this->length);
  std::tuple<unsigned_int&,unsigned_long&>::operator=(local_50,local_40);
  OVar3 = DWARFReader::getOffset(local_20);
  this->end = OVar3 + this->length;
  uVar2 = DWARFReader::getu16(local_20);
  this->version = uVar2;
  if (this->version < 3) {
    this->dwarfLen = 8;
  }
  if (this->version < 5) {
    if (this->version < 3) {
      local_2b8 = 4;
    }
    else {
      local_2b8 = this->dwarfLen;
    }
    uVar4 = DWARFReader::getuint(local_20,local_2b8);
    this->abbrevOffset = uVar4;
    bVar1 = DWARFReader::getu8(local_20);
    this->addrlen = bVar1;
    local_20->addrLen = (uint)bVar1;
  }
  else {
    bVar1 = DWARFReader::getu8(local_20);
    this->unitType = (uint)bVar1;
    if (this->unitType - DW_UT_compile < 3) {
      bVar1 = DWARFReader::getu8(local_20);
      this->addrlen = bVar1;
      local_20->addrLen = (uint)bVar1;
      uVar4 = DWARFReader::getuint(local_20,this->dwarfLen);
      this->abbrevOffset = uVar4;
    }
    else {
      if (2 < this->unitType - DW_UT_skeleton) {
        this_01 = (Exception *)__cxa_allocate_exception();
        memset(&local_1f0,0,0x1a0);
        Exception::Exception(&local_1f0);
        pEVar5 = Exception::operator<<
                           (&local_1f0,(char (*) [34])"unhandled DW_UT_ unit type value ");
        pEVar5 = Exception::operator<<(pEVar5,&this->unitType);
        Exception::Exception(this_01,pEVar5);
        __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
      }
      bVar1 = DWARFReader::getu8(local_20);
      this->addrlen = bVar1;
      local_20->addrLen = (uint)bVar1;
      uVar4 = DWARFReader::getuint(local_20,this->dwarfLen);
      this_00 = local_20;
      this->abbrevOffset = uVar4;
      to = std::array<unsigned_char,_8UL>::operator[](&this->id,0);
      DWARFReader::getBytes(this_00,8,to);
    }
  }
  OVar3 = DWARFReader::getOffset(local_20);
  this->rootOffset = OVar3;
  return;
}

Assistant:

Unit::Unit(const Info *di, DWARFReader &r)
    : abbrevOffset{ 0 }
    , dwarf(di)
    , unitType(DW_UT_compile)
    , id{}
{
    offset = r.getOffset();
    std::tie(length, dwarfLen) = r.getlength();
    end = r.getOffset() + length;
    version = r.getu16();

    if (version <= 2) // DWARF Version 2 uses the architecture's address size.
       dwarfLen = ELF_BYTES;
    if (version >= 5) {
        unitType = UnitType(r.getu8());
        switch (unitType) {
        case DW_UT_compile:
        case DW_UT_type:
        case DW_UT_partial:
            r.addrLen = addrlen = r.getu8();
            abbrevOffset = r.getuint(dwarfLen);
            break;
        case DW_UT_skeleton:
        case DW_UT_split_compile:
        case DW_UT_split_type:
            r.addrLen = addrlen = r.getu8();
            abbrevOffset = r.getuint(dwarfLen);
            r.getBytes(sizeof id, &id[0]);
            break;
        default:
            throw (Exception() << "unhandled DW_UT_ unit type value " << unitType);
        }
    } else {
        abbrevOffset = r.getuint(version <= 2 ? 4 : dwarfLen);
        r.addrLen = addrlen = r.getu8();
    }
    rootOffset = r.getOffset();
    // we now have enough info to parse the abbreviations and the DIE tree.
}